

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O1

void __thiscall WorkQueue<HTTPClosure>::Run(WorkQueue<HTTPClosure> *this)

{
  _Elt_pointer puVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  _Head_base<0UL,_HTTPClosure_*,_false> _Var5;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  unique_lock<std::mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    local_48._M_owns = false;
    local_48._M_device = (mutex_type *)this;
    std::unique_lock<std::mutex>::lock(&local_48);
    cVar3 = this->running;
    if ((bool)cVar3 == true) {
      do {
        if ((this->queue).
            super__Deque_base<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            (this->queue).
            super__Deque_base<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          if (cVar3 != '\0') goto LAB_0048489a;
          break;
        }
        std::condition_variable::wait((unique_lock *)&this->cond);
        cVar3 = this->running;
      } while ((bool)cVar3 != false);
    }
    if ((this->queue).
        super__Deque_base<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (this->queue).
        super__Deque_base<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      iVar4 = 3;
      _Var5._M_head_impl = (HTTPClosure *)0x0;
      bVar2 = false;
    }
    else {
LAB_0048489a:
      puVar1 = (this->queue).
               super__Deque_base<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      _Var5._M_head_impl =
           (puVar1->_M_t).super___uniq_ptr_impl<HTTPClosure,_std::default_delete<HTTPClosure>_>._M_t
           .super__Tuple_impl<0UL,_HTTPClosure_*,_std::default_delete<HTTPClosure>_>.
           super__Head_base<0UL,_HTTPClosure_*,_false>._M_head_impl;
      (puVar1->_M_t).super___uniq_ptr_impl<HTTPClosure,_std::default_delete<HTTPClosure>_>._M_t.
      super__Tuple_impl<0UL,_HTTPClosure_*,_std::default_delete<HTTPClosure>_>.
      super__Head_base<0UL,_HTTPClosure_*,_false>._M_head_impl = (HTTPClosure *)0x0;
      std::
      deque<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
      ::pop_front(&this->queue);
      iVar4 = 0;
      bVar2 = true;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_48);
    if (bVar2) {
      iVar4 = 0;
      (**(_Var5._M_head_impl)->_vptr_HTTPClosure)(_Var5._M_head_impl);
    }
    if (_Var5._M_head_impl != (HTTPClosure *)0x0) {
      (*(_Var5._M_head_impl)->_vptr_HTTPClosure[2])(_Var5._M_head_impl);
    }
    if (iVar4 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

void Run() EXCLUSIVE_LOCKS_REQUIRED(!cs)
    {
        while (true) {
            std::unique_ptr<WorkItem> i;
            {
                WAIT_LOCK(cs, lock);
                while (running && queue.empty())
                    cond.wait(lock);
                if (!running && queue.empty())
                    break;
                i = std::move(queue.front());
                queue.pop_front();
            }
            (*i)();
        }
    }